

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_bytedata.cpp
# Opt level: O2

void __thiscall cfd::core::Serializer::AddVariableBuffer(Serializer *this,ByteData *buffer)

{
  CfdException *this_00;
  allocator local_51;
  undefined1 local_50 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&buf,&buffer->data_);
  if ((ulong)((long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start) >> 0x20 == 0) {
    AddVariableBuffer(this,buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                           _M_impl.super__Vector_impl_data._M_start,
                      (uint32_t)
                      ((long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start));
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return;
  }
  local_50._0_8_ = "cfdcore_bytedata.cpp";
  local_50._8_4_ = 0x184;
  local_50._16_8_ = "AddVariableBuffer";
  logger::warn<>((CfdSourceLocation *)local_50,"It exceeds the handling size.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_50,"It exceeds the handling size.",&local_51);
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_50);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Serializer::AddVariableBuffer(const ByteData& buffer) {
  auto buf = buffer.GetBytes();
  if (buf.size() > std::numeric_limits<uint32_t>::max()) {
    warn(CFD_LOG_SOURCE, "It exceeds the handling size.");
    throw CfdException(kCfdIllegalStateError, "It exceeds the handling size.");
  }
  AddVariableBuffer(buf.data(), static_cast<uint32_t>(buf.size()));
}